

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_example1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  uint32_t i;
  uint32_t x;
  long lVar2;
  Roaring r1;
  Roaring64Map r2;
  
  roaring::Roaring::Roaring(&r1);
  for (x = 100; x != 1000; x = x + 1) {
    roaring::Roaring::add(&r1,x);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  roaring::Roaring::cardinality(&r1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  r2.roarings._M_t._M_impl._0_8_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  r2.copyOnWrite = false;
  r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       r2.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar2 = 0; lVar2 != 900; lVar2 = lVar2 + 1) {
    roaring::Roaring64Map::add(&r2,lVar2 + 0xf9ccd8a1c5080064);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  roaring::Roaring64Map::cardinality(&r2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&r2);
  roaring::Roaring::~Roaring(&r1);
  return 0;
}

Assistant:

int main() {
    Roaring r1;
    for (uint32_t i = 100; i < 1000; i++) {
        r1.add(i);
    }
    std::cout << "cardinality = " << r1.cardinality() << std::endl;

    Roaring64Map r2;
    for (uint64_t i = 18000000000000000100ull; i < 18000000000000001000ull;
         i++) {
        r2.add(i);
    }
    std::cout << "cardinality = " << r2.cardinality() << std::endl;
    return EXIT_SUCCESS;
}